

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
write_double<long_double>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,longdouble value,format_specs *spec)

{
  core_format_specs spec_00;
  bool bVar1;
  alignment aVar2;
  char *pcVar3;
  align_spec *in_RSI;
  buffer *in_RDI;
  counting_iterator<char> cVar4;
  longdouble in_stack_00000008;
  counting_iterator<char> *it;
  align_spec as;
  size_t n;
  format_specs normalized_spec;
  bool use_grisu;
  memory_buffer buffer;
  write_inf_or_nan_t write_inf_or_nan;
  char sign;
  float_spec_handler handler;
  float_spec_handler *in_stack_fffffffffffffca8;
  allocator<char> *alloc;
  counting_iterator<char> *this_00;
  undefined2 uVar5;
  undefined5 in_stack_fffffffffffffcb2;
  char in_stack_fffffffffffffcb7;
  char *in_stack_fffffffffffffcb8;
  undefined6 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc6;
  undefined1 in_stack_fffffffffffffcc7;
  undefined2 in_stack_fffffffffffffcc8;
  char local_309;
  float_spec_handler *this_01;
  undefined2 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd11;
  counting_iterator<char> local_2d0;
  counting_iterator<char> *local_2c0;
  undefined8 local_2b4;
  alignment local_2ac;
  size_t local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined1 uStack_288;
  char cStack_287;
  undefined2 uStack_286;
  undefined1 local_275;
  allocator<char> local_261;
  basic_buffer<char> local_260;
  double_writer *in_stack_fffffffffffffdc0;
  align_spec *in_stack_fffffffffffffdc8;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_fffffffffffffdd0;
  char local_23;
  float_spec_handler local_22;
  align_spec *local_20;
  longdouble local_18;
  
  local_18 = in_stack_00000008;
  this_01 = &local_22;
  local_20 = in_RSI;
  float_spec_handler::float_spec_handler(this_01,*(char *)((long)&in_RSI[1].fill_ + 1));
  internal::handle_float_type_spec<fmt::v5::float_spec_handler&>
            (in_stack_fffffffffffffcb7,in_stack_fffffffffffffca8);
  local_23 = '\0';
  bVar1 = std::signbit(local_18);
  if (bVar1) {
    local_23 = '-';
    local_18 = -local_18;
  }
  else {
    bVar1 = core_format_specs::has((core_format_specs *)(local_20 + 1),1);
    if (bVar1) {
      bVar1 = core_format_specs::has((core_format_specs *)(local_20 + 1),2);
      local_309 = '+';
      if (!bVar1) {
        local_309 = ' ';
      }
      local_23 = local_309;
    }
  }
  bVar1 = std::numeric_limits<fmt::v5::internal::dummy_int>::isnotanumber<long_double>
                    ((longdouble)
                     CONCAT28(in_stack_fffffffffffffcc8,
                              CONCAT17(in_stack_fffffffffffffcc7,
                                       CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)
                                      )));
  if (bVar1) {
    write_double<long_double>::write_inf_or_nan_t::operator()
              ((write_inf_or_nan_t *)
               CONCAT17(in_stack_fffffffffffffcc7,
                        CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
               in_stack_fffffffffffffcb8);
  }
  else {
    alloc = SUB108(local_18,0);
    uVar5 = (undefined2)((unkuint10)local_18 >> 0x40);
    bVar1 = std::numeric_limits<fmt::v5::internal::dummy_int>::isinfinity<long_double>
                      ((longdouble)
                       CONCAT28(in_stack_fffffffffffffcc8,
                                CONCAT17(in_stack_fffffffffffffcc7,
                                         CONCAT16(in_stack_fffffffffffffcc6,
                                                  in_stack_fffffffffffffcc0))));
    if (bVar1) {
      write_double<long_double>::write_inf_or_nan_t::operator()
                ((write_inf_or_nan_t *)
                 CONCAT17(in_stack_fffffffffffffcc7,
                          CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)),
                 in_stack_fffffffffffffcb8);
    }
    else {
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcb7,CONCAT52(in_stack_fffffffffffffcb2,uVar5)),alloc
                );
      std::allocator<char>::~allocator(&local_261);
      local_275 = 0;
      uStack_288 = (undefined1)local_20[1].fill_;
      uStack_286 = (undefined2)((uint)local_20[1].fill_ >> 0x10);
      local_298._0_4_ = local_20->width_;
      local_298._4_4_ = local_20->fill_;
      uStack_290 = (undefined4)*(undefined8 *)&local_20->align_;
      uStack_28c = (undefined4)((ulong)*(undefined8 *)&local_20->align_ >> 0x20);
      cStack_287 = local_22.type;
      local_2a0 = CONCAT26(uStack_286,CONCAT15(local_22.type,CONCAT14(uStack_288,uStack_28c)));
      this_00 = SUB108(local_18,0);
      uVar5 = (undefined2)((unkuint10)local_18 >> 0x40);
      spec_00._1_7_ = in_stack_fffffffffffffd11;
      spec_00.precision._0_1_ = in_stack_fffffffffffffd10;
      internal::sprintf_format<long_double>
                ((longdouble)CONCAT28(in_stack_fffffffffffffd08,this_01),in_RDI,spec_00);
      local_2a8 = internal::basic_buffer<char>::size(&local_260);
      local_2b4._0_4_ = local_20->width_;
      local_2b4._4_4_ = local_20->fill_;
      local_2ac = local_20->align_;
      aVar2 = align_spec::align(local_20);
      if (aVar2 == ALIGN_NUMERIC) {
        if (local_23 != '\0') {
          local_2c0 = reserve((basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                               *)CONCAT17(in_stack_fffffffffffffcb7,
                                          CONCAT52(in_stack_fffffffffffffcb2,uVar5)),(size_t)this_00
                             );
          cVar4 = internal::counting_iterator<char>::operator++(this_00,0);
          local_2d0.count_ = cVar4.count_;
          local_2d0.blackhole_ = cVar4.blackhole_;
          pcVar3 = internal::counting_iterator<char>::operator*(&local_2d0);
          *pcVar3 = local_23;
          if ((int)local_2b4 != 0) {
            local_2b4 = CONCAT44(local_2b4._4_4_,(int)local_2b4 + -1);
          }
        }
        local_2ac = ALIGN_RIGHT;
      }
      else {
        aVar2 = align_spec::align(local_20);
        if (aVar2 == ALIGN_DEFAULT) {
          local_2ac = ALIGN_RIGHT;
        }
        if (local_23 != '\0') {
          local_2a8 = local_2a8 + 1;
        }
      }
      basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
      write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::double_writer>
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcb7,CONCAT52(in_stack_fffffffffffffcb2,uVar5)));
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler handler(static_cast<char>(spec.type));
  internal::handle_float_type_spec(handler.type, handler);

  char sign = 0;
  // Use signbit instead of value < 0 because the latter is always
  // false for NaN.
  if (std::signbit(value)) {
    sign = '-';
    value = -value;
  } else if (spec.has(SIGN_FLAG)) {
    sign = spec.has(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(spec, inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  memory_buffer buffer;
  bool use_grisu = FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      spec.type != 'a' && spec.type != 'A' &&
      internal::grisu2_format(static_cast<double>(value), buffer, spec);
  if (!use_grisu) {
    format_specs normalized_spec(spec);
    normalized_spec.type = handler.type;
    internal::sprintf_format(value, buffer, normalized_spec);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = static_cast<char_type>(sign);
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(as, double_writer{n, sign, buffer});
}